

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

int Mio_CheckGates(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Pin_t *local_30;
  Mio_Pin_t *pPin;
  Mio_Pin_t *pPin0;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  
  pPin = (Mio_Pin_t *)0x0;
  pPin0 = (Mio_Pin_t *)Mio_LibraryReadGates(pLib);
  do {
    if (pPin0 == (Mio_Pin_t *)0x0) {
      return 1;
    }
    for (local_30 = Mio_GateReadPins((Mio_Gate_t *)pPin0); local_30 != (Mio_Pin_t *)0x0;
        local_30 = Mio_PinReadNext(local_30)) {
      iVar1 = Mio_CheckPins(pPin,local_30);
      if (iVar1 == 0) {
        return 0;
      }
      pPin = local_30;
    }
    pPin0 = (Mio_Pin_t *)Mio_GateReadNext((Mio_Gate_t *)pPin0);
  } while( true );
}

Assistant:

int Mio_CheckGates( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin0 = NULL, * pPin = NULL;
    Mio_LibraryForEachGate( pLib, pGate )
        Mio_GateForEachPin( pGate, pPin )
            if ( Mio_CheckPins( pPin0, pPin ) )
                pPin0 = pPin;
            else
                return 0;
    return 1;
}